

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_check_curve(mbedtls_ssl_context *ssl,mbedtls_ecp_group_id grp_id)

{
  mbedtls_ecp_group_id *local_28;
  mbedtls_ecp_group_id *gid;
  mbedtls_ecp_group_id grp_id_local;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->conf->curve_list != (mbedtls_ecp_group_id *)0x0) {
    for (local_28 = ssl->conf->curve_list; *local_28 != MBEDTLS_ECP_DP_NONE; local_28 = local_28 + 1
        ) {
      if (*local_28 == grp_id) {
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

int mbedtls_ssl_check_curve( const mbedtls_ssl_context *ssl, mbedtls_ecp_group_id grp_id )
{
    const mbedtls_ecp_group_id *gid;

    if( ssl->conf->curve_list == NULL )
        return( -1 );

    for( gid = ssl->conf->curve_list; *gid != MBEDTLS_ECP_DP_NONE; gid++ )
        if( *gid == grp_id )
            return( 0 );

    return( -1 );
}